

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_cluster_listen_accept(intptr_t uuid,fio_protocol_s *protocol)

{
  void *uuid_;
  fio_protocol_s *protocol_;
  fio_ls_s *pfVar1;
  int *piVar2;
  
  while( true ) {
    uuid_ = (void *)fio_accept(uuid);
    if (uuid_ == (void *)0xffffffffffffffff) {
      return;
    }
    protocol_ = fio_cluster_protocol_alloc
                          ((intptr_t)uuid_,fio_cluster_server_handler,fio_cluster_server_sender);
    fio_attach__internal(uuid_,protocol_);
    fio_lock(&cluster_data.lock);
    pfVar1 = (fio_ls_s *)calloc(0x18,1);
    if (pfVar1 == (fio_ls_s *)0x0) break;
    pfVar1->prev = cluster_data.clients.prev;
    pfVar1->next = &cluster_data.clients;
    pfVar1->obj = uuid_;
    (cluster_data.clients.prev)->next = pfVar1;
    LOCK();
    cluster_data.lock = '\0';
    UNLOCK();
    cluster_data.clients.prev = pfVar1;
  }
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR(
                  "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:3313"
                  );
  }
  kill(0,2);
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

static void fio_cluster_listen_accept(intptr_t uuid, fio_protocol_s *protocol) {
  (void)protocol;
  /* prevent `accept` backlog in parent */
  intptr_t client;
  while ((client = fio_accept(uuid)) != -1) {
    fio_attach(client,
               fio_cluster_protocol_alloc(client, fio_cluster_server_handler,
                                          fio_cluster_server_sender));
    fio_lock(&cluster_data.lock);
    fio_ls_push(&cluster_data.clients, (void *)client);
    fio_unlock(&cluster_data.lock);
  }
}